

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testInvalidUpsample(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *this;
  NeuralNetwork *pNVar5;
  NeuralNetworkLayer *this_00;
  UpsampleLayerParams *this_01;
  ostream *poVar6;
  Model m1;
  Result res;
  
  CoreML::Specification::Model::Model(&m1);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"input");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  this = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(this,5);
  CoreML::Specification::ArrayFeatureType::add_shape(this,5);
  CoreML::Specification::ArrayFeatureType::add_shape(this,5);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"probs");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pNVar5 = CoreML::Specification::Model::mutable_neuralnetwork(&m1);
  pNVar5->arrayinputshapemapping_ = 1;
  this_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                      (&pNVar5->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"probs");
  this_01 = CoreML::Specification::NeuralNetworkLayer::mutable_upsample(this_00);
  CoreML::Specification::UpsampleLayerParams::add_scalingfactor(this_01,1);
  CoreML::validate<(MLModelType)500>(&res,&m1);
  bVar1 = CoreML::Result::good(&res);
  if (bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0xbc5);
    poVar6 = std::operator<<(poVar6,": error: ");
    poVar6 = std::operator<<(poVar6,"!((res).good())");
    poVar6 = std::operator<<(poVar6," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m1);
  return (uint)bVar1;
}

Assistant:

int testInvalidUpsample() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(5);
    shape->add_shape(5);
    shape->add_shape(5);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    Specification::NeuralNetworkLayer *upsampleLayer = nn->add_layers();
    upsampleLayer->add_input("input");
    upsampleLayer->add_output("probs");
    auto *params = upsampleLayer->mutable_upsample();

    // Scaling factor needs to be 2D
    params->add_scalingfactor(1.0);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;
}